

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

uint64_t MeCab::fingerprint(char *str,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar15 [16];
  
  uVar3 = (uint)size;
  iVar9 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | size & 0xffffffff) / 0x10);
  lVar6 = (long)iVar9;
  lVar4 = (long)(iVar9 << 4);
  piVar7 = (int *)(str + lVar4 + lVar6 * -0x10 + 0xc);
  uVar1 = 0xfd14deff;
  uVar11 = 0xfd14deff;
  uVar10 = 0xfd14deff;
  uVar8 = 0xfd14deff;
  while (bVar12 = lVar6 != 0, lVar6 = lVar6 + -1, bVar12) {
    uVar8 = ((uint)(piVar7[-3] * 0x239b961b) >> 0x11 | piVar7[-3] * -0x34f28000) * -0x54f16877 ^
            uVar8;
    iVar9 = (uVar8 << 0x13 | uVar8 >> 0xd) + uVar10;
    uVar10 = ((uint)(piVar7[-2] * -0x54f16877) >> 0x10 | piVar7[-2] * -0x68770000) * 0x38b34ae5 ^
             uVar10;
    uVar8 = iVar9 * 5 + 0x561ccd1b;
    uVar10 = ((uVar10 << 0x11 | uVar10 >> 0xf) + uVar11) * 5 + 0xbcaa747;
    uVar11 = ((uint)(piVar7[-1] * 0x38b34ae5) >> 0xf | piVar7[-1] * -0x6a360000) * -0x5e1c746d ^
             uVar11;
    uVar2 = ((uint)(*piVar7 * -0x5e1c746d) >> 0xe | *piVar7 * 0x2e4c0000) * 0x239b961b ^ uVar1;
    uVar11 = ((uVar11 << 0xf | uVar11 >> 0x11) + uVar1) * 5 + 0x96cd1c35;
    uVar1 = ((uVar2 << 0xd | uVar2 >> 0x13) + iVar9 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
    piVar7 = piVar7 + 4;
  }
  uVar5 = 0;
  uVar2 = 0;
  switch(uVar3 & 0xf) {
  case 0xf:
    uVar2 = (uint)(byte)str[lVar4 + 0xe] << 0x10;
  case 0xe:
    uVar2 = uVar2 | (uint)(byte)str[lVar4 + 0xd] << 8;
  case 0xd:
    uVar1 = uVar1 ^ (((byte)str[lVar4 + 0xc] ^ uVar2) * -0x5e1c746d >> 0xe |
                    ((byte)str[lVar4 + 0xc] ^ uVar2) * 0x2e4c0000) * 0x239b961b;
  case 0xc:
    uVar2 = (uint)(byte)str[lVar4 + 0xb] << 0x18;
  case 0xb:
    uVar2 = uVar2 | (uint)(byte)str[lVar4 + 10] << 0x10;
  case 10:
    uVar2 = uVar2 ^ (uint)(byte)str[lVar4 + 9] << 8;
  case 9:
    uVar11 = uVar11 ^ (((byte)str[lVar4 + 8] ^ uVar2) * 0x38b34ae5 >> 0xf |
                      ((byte)str[lVar4 + 8] ^ uVar2) * -0x6a360000) * -0x5e1c746d;
  case 8:
    uVar2 = (uint)(byte)str[lVar4 + 7] << 0x18;
  case 7:
    uVar2 = uVar2 | (uint)(byte)str[lVar4 + 6] << 0x10;
  case 6:
    uVar2 = uVar2 ^ (uint)(byte)str[lVar4 + 5] << 8;
  case 5:
    uVar10 = uVar10 ^ (((byte)str[lVar4 + 4] ^ uVar2) * -0x54f16877 >> 0x10 |
                      ((byte)str[lVar4 + 4] ^ uVar2) * -0x68770000) * 0x38b34ae5;
  case 4:
    uVar2 = (uint)(byte)str[lVar4 + 3] << 0x18;
  case 3:
    uVar5 = uVar2 | (uint)(byte)str[lVar4 + 2] << 0x10;
  case 2:
    uVar5 = uVar5 ^ (uint)(byte)str[lVar4 + 1] << 8;
  case 1:
    uVar8 = uVar8 ^ (((byte)str[lVar4] ^ uVar5) * 0x239b961b >> 0x11 |
                    ((byte)str[lVar4] ^ uVar5) * -0x34f28000) * -0x54f16877;
  case 0:
    uVar8 = (uVar8 ^ uVar3) + (uVar10 ^ uVar3) + (uVar11 ^ uVar3) + (uVar1 ^ uVar3);
    uVar10 = (uVar10 ^ uVar3) + uVar8;
    uVar11 = (uVar11 ^ uVar3) + uVar8;
    uVar1 = (uVar1 ^ uVar3) + uVar8;
    auVar17._12_4_ = uVar1;
    auVar17._8_4_ = uVar11;
    auVar17._4_4_ = uVar8;
    auVar17._0_4_ = uVar10;
    auVar13._0_4_ = uVar10 >> 0x10;
    auVar13._4_4_ = uVar8 >> 0x10;
    auVar13._8_4_ = uVar11 >> 0x10;
    auVar13._12_4_ = uVar1 >> 0x10;
    auVar13 = auVar13 ^ auVar17;
    iVar9 = auVar13._4_4_;
    auVar18._4_4_ = iVar9;
    auVar18._0_4_ = iVar9;
    auVar18._8_4_ = auVar13._12_4_;
    auVar18._12_4_ = auVar13._12_4_;
    auVar14._0_4_ = auVar13._0_4_ * -0x7a143595;
    auVar15._8_4_ = (uint)((auVar13._8_8_ & 0xffffffff) * 0x85ebca6b);
    auVar15._4_4_ = auVar15._8_4_;
    auVar15._0_4_ = auVar14._0_4_;
    uVar10 = (uint)((auVar18._8_8_ & 0xffffffff) * 0x85ebca6b);
    auVar15._12_4_ = uVar10;
    auVar14._8_8_ = auVar15._8_8_;
    auVar14._4_4_ = iVar9 * -0x7a143595;
    auVar16._0_4_ = auVar14._0_4_ >> 0xd;
    auVar16._4_4_ = (uint)(iVar9 * -0x7a143595) >> 0xd;
    auVar16._8_4_ = auVar15._8_4_ >> 0xd;
    auVar16._12_4_ = uVar10 >> 0xd;
    auVar16 = auVar16 ^ auVar14;
    iVar9 = auVar16._4_4_;
    auVar19._4_4_ = iVar9;
    auVar19._0_4_ = iVar9;
    auVar19._8_4_ = auVar16._12_4_;
    auVar19._12_4_ = auVar16._12_4_;
    uVar10 = auVar16._0_4_ * -0x3d4d51cb;
    uVar1 = (uint)((auVar16._8_8_ & 0xffffffff) * 0xc2b2ae35);
    uVar8 = (uint)((auVar19._8_8_ & 0xffffffff) * 0xc2b2ae35);
    uVar10 = uVar10 >> 0x10 ^ uVar10;
    iVar9 = (uVar8 >> 0x10 ^ uVar8) + ((uint)(iVar9 * -0x3d4d51cb) >> 0x10 ^ iVar9 * -0x3d4d51cb) +
            (uVar1 >> 0x10 ^ uVar1) + uVar10;
    return CONCAT44(uVar10 + iVar9,iVar9);
  }
}

Assistant:

uint64_t fingerprint(const char *str, size_t size) {
  uint64_t result[2] = { 0 };
  const uint32_t kFingerPrint32Seed = 0xfd14deff;
  MurmurHash3_x86_128(str, size, kFingerPrint32Seed,
		      reinterpret_cast<char *>(result));
  return result[0];
}